

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::XmlUnitTestResultPrinter::PrintXmlUnitTest
               (ostream *stream,UnitTest *unit_test)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  TestSuite *in_RDI;
  ostream *unaff_retaddr;
  TestResult *in_stack_00000098;
  ostream *in_stack_000000a0;
  int i;
  string kTestsuites;
  int in_stack_fffffffffffffbdc;
  UnitTest *in_stack_fffffffffffffbe0;
  TestResult *in_stack_fffffffffffffbe8;
  int *in_stack_fffffffffffffc08;
  allocator<char> *in_stack_fffffffffffffc10;
  char *in_stack_fffffffffffffc18;
  undefined4 in_stack_fffffffffffffc20;
  undefined4 in_stack_fffffffffffffc24;
  string *in_stack_fffffffffffffcb8;
  TestSuite *value;
  string *in_stack_fffffffffffffcc0;
  string *name;
  undefined4 in_stack_fffffffffffffcc8;
  undefined4 in_stack_fffffffffffffccc;
  ostream *in_stack_fffffffffffffcd0;
  int local_2e0;
  allocator<char> local_2d9;
  string local_2d8 [39];
  allocator<char> local_2b1;
  string local_2b0 [32];
  string *in_stack_fffffffffffffd70;
  TestResult *in_stack_fffffffffffffd78;
  ostream *in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffd9c;
  string local_260 [39];
  allocator<char> local_239;
  string local_238 [32];
  string local_218 [39];
  allocator<char> local_1f1;
  string local_1f0 [32];
  string local_1d0 [39];
  allocator<char> local_1a9;
  string local_1a8 [39];
  allocator<char> local_181;
  string local_180 [8];
  TimeInMillis in_stack_fffffffffffffe88;
  undefined1 local_159 [37];
  int local_134;
  string local_130 [39];
  allocator<char> local_109;
  string local_108 [36];
  int local_e4;
  string local_e0 [39];
  allocator<char> local_b9;
  string local_b8 [36];
  int local_94;
  string local_90 [39];
  allocator<char> local_69;
  string local_68 [55];
  allocator<char> local_31;
  string local_30 [40];
  TestSuite *test_suite;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),in_stack_fffffffffffffc18
             ,in_stack_fffffffffffffc10);
  std::allocator<char>::~allocator(&local_31);
  std::operator<<((ostream *)in_RDI,"<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n");
  poVar3 = std::operator<<((ostream *)in_RDI,"<");
  std::operator<<(poVar3,local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),in_stack_fffffffffffffc18
             ,in_stack_fffffffffffffc10);
  local_94 = UnitTest::reportable_test_count((UnitTest *)0x192252);
  StreamableToString<int>(in_stack_fffffffffffffc08);
  OutputXmlAttribute(in_stack_fffffffffffffcd0,
                     (string *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
                     in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator(&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),in_stack_fffffffffffffc18
             ,in_stack_fffffffffffffc10);
  local_e4 = UnitTest::failed_test_count((UnitTest *)0x19231e);
  StreamableToString<int>(in_stack_fffffffffffffc08);
  OutputXmlAttribute(in_stack_fffffffffffffcd0,
                     (string *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
                     in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
  std::__cxx11::string::~string(local_e0);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator(&local_b9);
  value = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),in_stack_fffffffffffffc18
             ,in_stack_fffffffffffffc10);
  iVar2 = UnitTest::reportable_disabled_test_count((UnitTest *)0x1923ea);
  local_134 = iVar2;
  StreamableToString<int>(in_stack_fffffffffffffc08);
  OutputXmlAttribute((ostream *)in_RDI,(string *)CONCAT44(iVar2,in_stack_fffffffffffffcc8),
                     in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
  std::__cxx11::string::~string(local_130);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator(&local_109);
  name = (string *)local_159;
  test_suite = value;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),in_stack_fffffffffffffc18
             ,in_stack_fffffffffffffc10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),in_stack_fffffffffffffc18
             ,in_stack_fffffffffffffc10);
  OutputXmlAttribute((ostream *)in_RDI,(string *)CONCAT44(iVar2,in_stack_fffffffffffffcc8),name,
                     (string *)value);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator(&local_181);
  std::__cxx11::string::~string((string *)(local_159 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_159);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),in_stack_fffffffffffffc18
             ,in_stack_fffffffffffffc10);
  UnitTest::elapsed_time((UnitTest *)0x192587);
  FormatTimeInMillisAsSeconds_abi_cxx11_
            (CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
  OutputXmlAttribute((ostream *)in_RDI,(string *)CONCAT44(iVar2,in_stack_fffffffffffffcc8),name,
                     (string *)value);
  std::__cxx11::string::~string(local_1d0);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),in_stack_fffffffffffffc18
             ,in_stack_fffffffffffffc10);
  UnitTest::start_timestamp((UnitTest *)0x192646);
  FormatEpochTimeInMillisAsIso8601_abi_cxx11_(in_stack_fffffffffffffe88);
  OutputXmlAttribute((ostream *)in_RDI,(string *)CONCAT44(iVar2,in_stack_fffffffffffffcc8),name,
                     (string *)value);
  std::__cxx11::string::~string(local_218);
  std::__cxx11::string::~string(local_1f0);
  std::allocator<char>::~allocator(&local_1f1);
  if ((FLAGS_gtest_shuffle & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
               in_stack_fffffffffffffc18,in_stack_fffffffffffffc10);
    UnitTest::random_seed((UnitTest *)0x192712);
    StreamableToString<int>(in_stack_fffffffffffffc08);
    OutputXmlAttribute((ostream *)in_RDI,(string *)CONCAT44(iVar2,in_stack_fffffffffffffcc8),name,
                       (string *)value);
    std::__cxx11::string::~string(local_260);
    std::__cxx11::string::~string(local_238);
    std::allocator<char>::~allocator(&local_239);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),in_stack_fffffffffffffc18
             ,in_stack_fffffffffffffc10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),in_stack_fffffffffffffc18
             ,in_stack_fffffffffffffc10);
  OutputXmlAttribute((ostream *)in_RDI,(string *)CONCAT44(iVar2,in_stack_fffffffffffffcc8),name,
                     (string *)value);
  std::__cxx11::string::~string(local_2b0);
  std::allocator<char>::~allocator(&local_2b1);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffd78);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffd77);
  std::operator<<((ostream *)test_suite,">\n");
  UnitTest::ad_hoc_test_result((UnitTest *)0x192bce);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),in_stack_fffffffffffffc18
             ,in_stack_fffffffffffffc10);
  OutputXmlTestProperties
            (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
  std::__cxx11::string::~string(local_2d8);
  std::allocator<char>::~allocator(&local_2d9);
  for (local_2e0 = 0; iVar2 = UnitTest::total_test_suite_count((UnitTest *)0x192c58),
      local_2e0 < iVar2; local_2e0 = local_2e0 + 1) {
    UnitTest::GetTestSuite(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbdc);
    iVar2 = TestSuite::reportable_test_count((TestSuite *)0x192c93);
    if (0 < iVar2) {
      UnitTest::GetTestSuite(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbdc);
      PrintXmlTestSuite(unaff_retaddr,test_suite);
    }
  }
  UnitTest::ad_hoc_test_result((UnitTest *)0x192dcb);
  bVar1 = TestResult::Failed(in_stack_fffffffffffffbe8);
  if (bVar1) {
    UnitTest::ad_hoc_test_result((UnitTest *)0x192e06);
    OutputXmlTestSuiteForTestResult(in_stack_000000a0,in_stack_00000098);
  }
  poVar3 = std::operator<<((ostream *)test_suite,"</");
  poVar3 = std::operator<<(poVar3,local_30);
  std::operator<<(poVar3,">\n");
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void XmlUnitTestResultPrinter::PrintXmlUnitTest(std::ostream* stream,
                                                const UnitTest& unit_test) {
  const std::string kTestsuites = "testsuites";

  *stream << "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n";
  *stream << "<" << kTestsuites;

  OutputXmlAttribute(stream, kTestsuites, "tests",
                     StreamableToString(unit_test.reportable_test_count()));
  OutputXmlAttribute(stream, kTestsuites, "failures",
                     StreamableToString(unit_test.failed_test_count()));
  OutputXmlAttribute(
      stream, kTestsuites, "disabled",
      StreamableToString(unit_test.reportable_disabled_test_count()));
  OutputXmlAttribute(stream, kTestsuites, "errors", "0");
  OutputXmlAttribute(stream, kTestsuites, "time",
                     FormatTimeInMillisAsSeconds(unit_test.elapsed_time()));
  OutputXmlAttribute(
      stream, kTestsuites, "timestamp",
      FormatEpochTimeInMillisAsIso8601(unit_test.start_timestamp()));

  if (GTEST_FLAG_GET(shuffle)) {
    OutputXmlAttribute(stream, kTestsuites, "random_seed",
                       StreamableToString(unit_test.random_seed()));
  }

  OutputXmlAttribute(stream, kTestsuites, "name", "AllTests");
  *stream << ">\n";

  OutputXmlTestProperties(stream, unit_test.ad_hoc_test_result(),
                          /*indent=*/"  ");
  for (int i = 0; i < unit_test.total_test_suite_count(); ++i) {
    if (unit_test.GetTestSuite(i)->reportable_test_count() > 0)
      PrintXmlTestSuite(stream, *unit_test.GetTestSuite(i));
  }

  // If there was a test failure outside of one of the test suites (like in a
  // test environment) include that in the output.
  if (unit_test.ad_hoc_test_result().Failed()) {
    OutputXmlTestSuiteForTestResult(stream, unit_test.ad_hoc_test_result());
  }

  *stream << "</" << kTestsuites << ">\n";
}